

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cc
# Opt level: O2

void __thiscall draco::Options::SetBool(Options *this,string *name,bool val)

{
  mapped_type *this_00;
  undefined3 in_register_00000011;
  string local_30;
  
  std::__cxx11::to_string(&local_30,CONCAT31(in_register_00000011,val));
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this->options_,name);
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void Options::SetBool(const std::string &name, bool val) {
  options_[name] = std::to_string(val ? 1 : 0);
}